

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O1

void __thiscall kj::Vector<capnp::Schema>::~Vector(Vector<capnp::Schema> *this)

{
  Schema *pSVar1;
  RemoveConst<capnp::Schema> *pRVar2;
  Schema *pSVar3;
  ArrayDisposer *pAVar4;
  
  pSVar1 = (this->builder).ptr;
  if (pSVar1 != (Schema *)0x0) {
    pRVar2 = (this->builder).pos;
    pSVar3 = (this->builder).endPtr;
    (this->builder).ptr = (Schema *)0x0;
    (this->builder).pos = (RemoveConst<capnp::Schema> *)0x0;
    (this->builder).endPtr = (Schema *)0x0;
    pAVar4 = (this->builder).disposer;
    (*(code *)**(undefined8 **)pAVar4)
              (pAVar4,pSVar1,8,(long)pRVar2 - (long)pSVar1 >> 3,(long)pSVar3 - (long)pSVar1 >> 3,0);
    return;
  }
  return;
}

Assistant:

inline void dispose() {
    // Make sure that if an exception is thrown, we are left with a null ptr, so we won't possibly
    // dispose again.
    T* ptrCopy = ptr;
    T* posCopy = pos;
    T* endCopy = endPtr;
    if (ptrCopy != nullptr) {
      ptr = nullptr;
      pos = nullptr;
      endPtr = nullptr;
      disposer->dispose(ptrCopy, posCopy - ptrCopy, endCopy - ptrCopy);
    }
  }